

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsMessageCopy(HelicsMessage source_message,HelicsMessage dest_message,HelicsError *err)

{
  size_t size;
  
  if (err == (HelicsError *)0x0) {
    if (source_message == (HelicsMessage)0x0) {
      return;
    }
    if (dest_message == (HelicsMessage)0x0) {
      return;
    }
    if (*(short *)((long)source_message + 10) != 0xb3) {
      return;
    }
    if (*(short *)((long)dest_message + 10) != 0xb3) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((((source_message == (HelicsMessage)0x0) || (*(short *)((long)source_message + 10) != 0xb3))
        || (dest_message == (HelicsMessage)0x0)) || (*(short *)((long)dest_message + 10) != 0xb3)) {
      err->error_code = -4;
      err->message = "The message object was not valid";
      return;
    }
  }
  if (dest_message != source_message) {
    size = *(size_t *)((long)source_message + 0x50);
    helics::SmallBuffer::reserve((SmallBuffer *)((long)dest_message + 0x10),size);
    *(size_t *)((long)dest_message + 0x50) = size;
    memcpy(*(void **)((long)dest_message + 0x60),*(void **)((long)source_message + 0x60),
           *(size_t *)((long)source_message + 0x50));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)dest_message + 0x70),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)source_message + 0x70));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)dest_message + 0xb0),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)source_message + 0xb0));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)dest_message + 0x90),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)source_message + 0x90));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)dest_message + 0xd0),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)source_message + 0xd0));
  *(undefined8 *)dest_message = *source_message;
  *(undefined4 *)((long)dest_message + 0xc) = *(undefined4 *)((long)source_message + 0xc);
  *(undefined2 *)((long)dest_message + 8) = *(undefined2 *)((long)source_message + 8);
  return;
}

Assistant:

void helicsMessageCopy(HelicsMessage source_message, HelicsMessage dest_message, HelicsError* err)
{
    auto* mess_src = getMessageObj(source_message, err);
    if (mess_src == nullptr) {
        return;
    }
    auto* mess_dest = getMessageObj(dest_message, err);
    if (mess_dest == nullptr) {
        return;
    }
    mess_dest->data = mess_src->data;
    mess_dest->dest = mess_src->dest;
    mess_dest->original_source = mess_src->original_source;
    mess_dest->source = mess_src->source;
    mess_dest->original_dest = mess_src->original_dest;
    mess_dest->time = mess_src->time;
    mess_dest->messageID = mess_src->messageID;
    mess_dest->flags = mess_src->flags;
}